

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_gui.cpp
# Opt level: O0

QPoint QtGuiTest::toNativePixels(QPoint *value,QWindow *window)

{
  bool bVar1;
  QDebug *o;
  QPoint QVar2;
  QWindow *in_RSI;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  QDebug *unaff_retaddr;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff88;
  QMessageLogger *in_stack_ffffffffffffffa0;
  QDebug *in_stack_ffffffffffffffa8;
  QDebug local_38;
  QDebug local_30;
  QDebug in_stack_ffffffffffffffd8;
  QDebug local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  QWindow *window_00;
  
  window_00 = *(QWindow **)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  lcQtGuiTest();
  anon_unknown.dwarf_91466c::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_RSI,in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_91466c::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x4252c7);
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffa0,(char *)in_RDI,(int)((ulong)in_RSI >> 0x20),
               (char *)in_stack_ffffffffffffff88,(char *)0x4252dd);
    QMessageLogger::debug();
    o = QDebug::operator<<(in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffd8.stream);
    QDebug::QDebug(&local_30,o);
    ::operator<<((Stream *)&stack0xffffffffffffffd8,(QPoint *)&local_30);
    ::operator<<(unaff_retaddr,window_00);
    QDebug::~QDebug(&local_20);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffd8);
    QDebug::~QDebug(&local_30);
    QDebug::~QDebug(&local_38);
    local_10 = 0;
  }
  QVar2 = QHighDpi::toNativePixels<QPoint,QWindow>(in_RDI,in_RSI);
  if (*(QWindow **)(in_FS_OFFSET + 0x28) == window_00) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QPoint QtGuiTest::toNativePixels(const QPoint &value, const QWindow *window)
{
    Q_ASSERT_X(window,
               Q_FUNC_INFO,
               "called with nullptr");

    deb << "Calculating native pixels: " << value << window;
    return QHighDpi::toNativePixels<QPoint, QWindow>(value, window);
}